

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_game.cpp
# Opt level: O0

void __thiscall FCajunMaster::TryAddBot(FCajunMaster *this,BYTE **stream,int player)

{
  botskill_t skill_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BYTE *info_00;
  botinfo_t *local_40;
  botinfo_t *thebot;
  botskill_t skill;
  char *info;
  int botshift;
  int player_local;
  BYTE **stream_local;
  FCajunMaster *this_local;
  
  info._0_4_ = ReadByte(stream);
  info_00 = (BYTE *)ReadString(stream);
  iVar2 = ReadByte(stream);
  iVar3 = ReadByte(stream);
  iVar4 = ReadByte(stream);
  iVar5 = ReadByte(stream);
  local_40 = (botinfo_t *)0x0;
  if (consoleplayer == player) {
    local_40 = this->botinfo;
    for (; 0 < (int)info; info._0_4_ = (int)info + -1) {
      local_40 = local_40->next;
    }
  }
  skill_00.perfection = iVar3;
  skill_00.aiming = iVar2;
  skill_00.isp = iVar5;
  skill_00.reaction = iVar4;
  bVar1 = DoAddBot(this,info_00,skill_00);
  if (bVar1) {
    this->botnum = this->botnum + 1;
    if (local_40 != (botinfo_t *)0x0) {
      local_40->inuse = 2;
    }
  }
  else if (local_40 != (botinfo_t *)0x0) {
    local_40->inuse = 0;
  }
  if (info_00 != (BYTE *)0x0) {
    operator_delete__(info_00);
  }
  return;
}

Assistant:

void FCajunMaster::TryAddBot (BYTE **stream, int player)
{
	int botshift = ReadByte (stream);
	char *info = ReadString (stream);
	botskill_t skill;
	skill.aiming = ReadByte (stream);
	skill.perfection = ReadByte (stream);
	skill.reaction = ReadByte (stream);
	skill.isp = ReadByte (stream);

	botinfo_t *thebot = NULL;

	if (consoleplayer == player)
	{
		thebot = botinfo;

		while (botshift > 0)
		{
			thebot = thebot->next;
			botshift--;
		}
	}

	if (DoAddBot ((BYTE *)info, skill))
	{
		//Increment this.
		botnum++;

		if (thebot != NULL)
		{
			thebot->inuse = BOTINUSE_Yes;
		}
	}
	else
	{
		if (thebot != NULL)
		{
			thebot->inuse = BOTINUSE_No;
		}
	}

	delete[] info;
}